

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

bool __thiscall QMainWindowTabBar::event(QMainWindowTabBar *this,QEvent *e)

{
  long lVar1;
  Type TVar2;
  Shape SVar3;
  int iVar4;
  uint uVar5;
  sockaddr *__addr;
  int __fd;
  QEvent *in_RSI;
  QEvent *pQVar6;
  long *in_RDI;
  long in_FS_OFFSET;
  QSize hint;
  QSize size;
  QEvent *in_stack_00000050;
  QTabBar *in_stack_00000058;
  QWidget *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined1 local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = in_RSI;
  TVar2 = QEvent::type(in_RSI);
  __fd = (int)pQVar6;
  if (TVar2 != ToolTip) {
    local_29 = QTabBar::event(in_stack_00000058,in_stack_00000050);
    goto LAB_005f8022;
  }
  QWidget::size(in_stack_ffffffffffffffa8);
  (**(code **)(*in_RDI + 0x70))();
  SVar3 = QTabBar::shape((QTabBar *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (SVar3 == RoundedWest) {
LAB_005f7fa8:
    QSize::transposed((QSize *)in_stack_ffffffffffffffa8);
    QSize::transposed((QSize *)in_stack_ffffffffffffffa8);
  }
  else {
    SVar3 = QTabBar::shape((QTabBar *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
    ;
    if (SVar3 == RoundedEast) goto LAB_005f7fa8;
  }
  iVar4 = QSize::width((QSize *)0x5f7fe4);
  uVar5 = QSize::width((QSize *)0x5f7ff2);
  if (iVar4 < (int)uVar5) {
    local_29 = QTabBar::event(in_stack_00000058,in_stack_00000050);
  }
  else {
    QEvent::accept(in_RSI,__fd,__addr,(socklen_t *)(ulong)uVar5);
    local_29 = true;
  }
LAB_005f8022:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindowTabBar::event(QEvent *e)
{
    // show the tooltip if tab is too small to fit label

    if (e->type() != QEvent::ToolTip)
        return QTabBar::event(e);
    QSize size = this->size();
    QSize hint = sizeHint();
    if (shape() == QTabBar::RoundedWest || shape() == QTabBar::RoundedEast) {
        size = size.transposed();
        hint = hint.transposed();
    }
    if (size.width() < hint.width())
        return QTabBar::event(e);
    e->accept();
    return true;
}